

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_client.cpp
# Opt level: O3

void HaveATest(Socket *sock,InetAddress *serverAddr)

{
  bool bVar1;
  sockaddr *addr;
  sz_ssize_t sVar2;
  LogStream *pLVar3;
  size_t sVar4;
  char **ppcVar5;
  char *pcVar6;
  sz_sock sock_00;
  uint uVar7;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  SourceFile file_07;
  SourceFile file_08;
  SourceFile file_09;
  SourceFile file_10;
  SourceFile file_11;
  SourceFile file_12;
  SourceFile file_13;
  SourceFile file_14;
  SourceFile file_15;
  SourceFile file_16;
  SourceFile file_17;
  SourceFile file_18;
  SourceFile file_19;
  SourceFile file_20;
  SourceFile file_21;
  SourceFile file_22;
  Logger local_1020;
  sockaddr *local_50;
  sz_sock local_44;
  char local_40 [8];
  char recv [10];
  
  addr = sznet::net::sockets::sz_sockaddr_cast((sockaddr_in6 *)serverAddr);
  sock_00 = sock->m_sockfd;
  recv[0] = '\0';
  recv[1] = '\0';
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x13;
    file.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file,0x36);
    if (0x1e < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST1 BEGIN, no connect, block",
                      0x1e);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1e;
    }
    sznet::Logger::~Logger(&local_1020);
  }
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sznet::g_logLevel < 3) {
    file_00._8_8_ = 0x13;
    file_00.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_00,0x38);
    if (0x11 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_send rst: ",0x11);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x11;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    sznet::Logger::~Logger(&local_1020);
  }
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    file_02._8_8_ = 0x13;
    file_02.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_02,0x3d,false);
    if (0x13 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv error: ",0x13);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x13;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    sznet::Logger::~Logger(&local_1020);
LAB_0010dbca:
    if (sznet::g_logLevel < 3) {
      file_03._8_8_ = 0x13;
      file_03.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_03,0x45);
      if (0x1c < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST1 END, no connect, block",
                        0x1c);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1c
        ;
      }
      sznet::Logger::~Logger(&local_1020);
      if (sznet::g_logLevel < 3) {
        file_04._8_8_ = 0x13;
        file_04.m_data = "udp_echo_client.cpp";
        sznet::Logger::Logger(&local_1020,file_04,0x53);
        if (0x1b < (uint)(((int)&local_1020 + 0xfb0) -
                         (int)local_1020.m_impl.m_stream.m_buffer.m_cur)) {
          builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST2 BEGIN, connect, block",
                          0x1b);
          local_1020.m_impl.m_stream.m_buffer.m_cur =
               local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1b;
        }
        sznet::Logger::~Logger(&local_1020);
      }
    }
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (sznet::g_logLevel < 3) {
      file_01._8_8_ = 0x13;
      file_01.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_01,0x42);
      if (0x11 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv rst: ",0x11);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x11
        ;
      }
      local_50 = addr;
      pLVar3 = sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
      pcVar6 = (pLVar3->m_buffer).m_cur;
      ppcVar5 = &(pLVar3->m_buffer).m_cur;
      uVar7 = (int)ppcVar5 - (int)pcVar6;
      if (0xc < uVar7) {
        builtin_strncpy(pcVar6,", recv msg: ",0xc);
        pcVar6 = *ppcVar5 + 0xc;
        uVar7 = (int)ppcVar5 - (int)pcVar6;
        *ppcVar5 = pcVar6;
      }
      local_44 = sock_00;
      sVar4 = strlen(local_40);
      if (sVar4 < (ulong)(long)(int)uVar7) {
        memcpy(pcVar6,local_40,sVar4);
        *ppcVar5 = *ppcVar5 + sVar4;
      }
      sznet::Logger::~Logger(&local_1020);
      addr = local_50;
      sock_00 = local_44;
      goto LAB_0010dbca;
    }
  }
  sznet::net::sockets::sz_sock_connect(sock_00,addr);
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sVar2 < 0) {
    file_08._8_8_ = 0x13;
    file_08.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_08,0x59,false);
    if (0x1e < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"first call sz_udp_recv error: ",
                      0x1e);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1e;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    goto LAB_0010e5c5;
  }
  if (sznet::g_logLevel < 3) {
    file_05._8_8_ = 0x13;
    file_05.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_05,0x5c);
    if (0x1c < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"first call sz_udp_send rst: ",0x1c)
      ;
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1c;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    sznet::Logger::~Logger(&local_1020);
  }
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sVar2 < 0) {
    file_09._8_8_ = 0x13;
    file_09.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_09,0x61,false);
    if ((((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur & 0xffffffe0U)
        != 0) {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"second call sz_udp_recv error: ",
                      0x1f);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1f;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    goto LAB_0010e5c5;
  }
  if (sznet::g_logLevel < 3) {
    file_06._8_8_ = 0x13;
    file_06.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_06,100);
    if (0x1d < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"second call sz_udp_send rst: ",0x1d
                     );
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1d;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    sznet::Logger::~Logger(&local_1020);
  }
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    file_10._8_8_ = 0x13;
    file_10.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_10,0x69,false);
    if (0x13 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv error: ",0x13);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x13;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    sznet::Logger::~Logger(&local_1020);
LAB_0010dfe1:
    if (sznet::g_logLevel < 3) {
      file_11._8_8_ = 0x13;
      file_11.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_11,0x71);
      if (0x19 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST2 END, connect, block",0x19);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x19
        ;
      }
      sznet::Logger::~Logger(&local_1020);
      if (sznet::g_logLevel < 3) {
        file_12._8_8_ = 0x13;
        file_12.m_data = "udp_echo_client.cpp";
        sznet::Logger::Logger(&local_1020,file_12,0x7a);
        if (0x1d < (uint)(((int)&local_1020 + 0xfb0) -
                         (int)local_1020.m_impl.m_stream.m_buffer.m_cur)) {
          builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST3 BEGIN, connect, noblock",
                          0x1d);
          local_1020.m_impl.m_stream.m_buffer.m_cur =
               local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1d;
        }
        sznet::Logger::~Logger(&local_1020);
      }
    }
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (sznet::g_logLevel < 3) {
      file_07._8_8_ = 0x13;
      file_07.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_07,0x6e);
      if (0x11 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv rst: ",0x11);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x11
        ;
      }
      local_50 = addr;
      pLVar3 = sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
      pcVar6 = (pLVar3->m_buffer).m_cur;
      ppcVar5 = &(pLVar3->m_buffer).m_cur;
      uVar7 = (int)ppcVar5 - (int)pcVar6;
      if (0xc < uVar7) {
        builtin_strncpy(pcVar6,", recv msg: ",0xc);
        pcVar6 = *ppcVar5 + 0xc;
        uVar7 = (int)ppcVar5 - (int)pcVar6;
        *ppcVar5 = pcVar6;
      }
      local_44 = sock_00;
      sVar4 = strlen(local_40);
      if (sVar4 < (ulong)(long)(int)uVar7) {
        memcpy(pcVar6,local_40,sVar4);
        *ppcVar5 = *ppcVar5 + sVar4;
      }
      sznet::Logger::~Logger(&local_1020);
      addr = local_50;
      sock_00 = local_44;
      goto LAB_0010dfe1;
    }
  }
  sznet::net::sockets::sz_sock_setnonblock(sock_00,true);
  sznet::net::sockets::sz_sock_connect(sock_00,addr);
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sVar2 < 0) {
    file_15._8_8_ = 0x13;
    file_15.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_15,0x81,false);
    if (0x18 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"call sz_udp_recv error: ",0x18);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x18;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    goto LAB_0010e5c5;
  }
  if (sznet::g_logLevel < 3) {
    file_13._8_8_ = 0x13;
    file_13.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_13,0x84);
    if (0x16 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"call sz_udp_send rst: ",0x16);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x16;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    sznet::Logger::~Logger(&local_1020);
  }
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    bVar1 = sznet::net::sockets::sz_wouldblock();
    if (bVar1) {
      if (2 < sznet::g_logLevel) goto LAB_0010e42b;
      file_16._8_8_ = 0x13;
      file_16.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_16,0x8b);
      if (10 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
      {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"async recv",10);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 10;
      }
    }
    else {
      file_17._8_8_ = 0x13;
      file_17.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_17,0x8f,false);
      if (0x13 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv error: ",0x13);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x13
        ;
      }
      sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    }
    sznet::Logger::~Logger(&local_1020);
LAB_0010e36f:
    if (sznet::g_logLevel < 3) {
      file_18._8_8_ = 0x13;
      file_18.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_18,0x98);
      if (0x19 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST2 END, connect, block",0x19);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x19
        ;
      }
      sznet::Logger::~Logger(&local_1020);
      if (sznet::g_logLevel < 3) {
        file_19._8_8_ = 0x13;
        file_19.m_data = "udp_echo_client.cpp";
        sznet::Logger::Logger(&local_1020,file_19,0x9e);
        if (0x1e < (uint)(((int)&local_1020 + 0xfb0) -
                         (int)local_1020.m_impl.m_stream.m_buffer.m_cur)) {
          builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST4 BEGIN, no connect, block"
                          ,0x1e);
          local_1020.m_impl.m_stream.m_buffer.m_cur =
               local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1e;
        }
        sznet::Logger::~Logger(&local_1020);
      }
    }
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (sznet::g_logLevel < 3) {
      file_14._8_8_ = 0x13;
      file_14.m_data = "udp_echo_client.cpp";
      sznet::Logger::Logger(&local_1020,file_14,0x95);
      if (0x11 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv rst: ",0x11);
        local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x11
        ;
      }
      local_50 = addr;
      pLVar3 = sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
      pcVar6 = (pLVar3->m_buffer).m_cur;
      ppcVar5 = &(pLVar3->m_buffer).m_cur;
      uVar7 = (int)ppcVar5 - (int)pcVar6;
      if (0xc < uVar7) {
        builtin_strncpy(pcVar6,", recv msg: ",0xc);
        pcVar6 = *ppcVar5 + 0xc;
        uVar7 = (int)ppcVar5 - (int)pcVar6;
        *ppcVar5 = pcVar6;
      }
      local_44 = sock_00;
      sVar4 = strlen(local_40);
      if (sVar4 < (ulong)(long)(int)uVar7) {
        memcpy(pcVar6,local_40,sVar4);
        *ppcVar5 = *ppcVar5 + sVar4;
      }
      sznet::Logger::~Logger(&local_1020);
      addr = local_50;
      sock_00 = local_44;
      goto LAB_0010e36f;
    }
  }
LAB_0010e42b:
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    file_21._8_8_ = 0x13;
    file_21.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_21,0xa3,false);
    if (0x13 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv error: ",0x13);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x13;
    }
    sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (2 < sznet::g_logLevel) {
      return;
    }
    file_20._8_8_ = 0x13;
    file_20.m_data = "udp_echo_client.cpp";
    sznet::Logger::Logger(&local_1020,file_20,0xa8);
    if (0x11 < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv rst: ",0x11);
      local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x11;
    }
    pLVar3 = sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,sVar2);
    pcVar6 = (pLVar3->m_buffer).m_cur;
    ppcVar5 = &(pLVar3->m_buffer).m_cur;
    uVar7 = (int)ppcVar5 - (int)pcVar6;
    if (0xc < uVar7) {
      builtin_strncpy(pcVar6,", recv msg: ",0xc);
      pcVar6 = *ppcVar5 + 0xc;
      uVar7 = (int)ppcVar5 - (int)pcVar6;
      *ppcVar5 = pcVar6;
    }
    sVar4 = strlen(local_40);
    if (sVar4 < (ulong)(long)(int)uVar7) {
      memcpy(pcVar6,local_40,sVar4);
      *ppcVar5 = *ppcVar5 + sVar4;
    }
  }
  sznet::Logger::~Logger(&local_1020);
  if (2 < sznet::g_logLevel) {
    return;
  }
  file_22._8_8_ = 0x13;
  file_22.m_data = "udp_echo_client.cpp";
  sznet::Logger::Logger(&local_1020,file_22,0xab);
  if (0x1c < (uint)(((int)&local_1020 + 0xfb0) - (int)local_1020.m_impl.m_stream.m_buffer.m_cur)) {
    builtin_strncpy(local_1020.m_impl.m_stream.m_buffer.m_cur,"TEST4 END, no connect, block",0x1c);
    local_1020.m_impl.m_stream.m_buffer.m_cur = local_1020.m_impl.m_stream.m_buffer.m_cur + 0x1c;
  }
LAB_0010e5c5:
  sznet::Logger::~Logger(&local_1020);
  return;
}

Assistant:

void HaveATest(Socket& sock, const InetAddress& serverAddr)
{
    struct sockaddr * serverSockAddr = const_cast<struct sockaddr*>(serverAddr.getSockAddr());
    sockets::sz_sock csock = sock.fd();
    const char* msg = "hello";
    const void* sendMsg = reinterpret_cast<const void*>(msg);
    int sendLen = static_cast<int>(strlen(msg));
    char recv[10] = {};
    void* recvBuf = reinterpret_cast<void*>(recv);
    int recvLen = 10;
    sz_ssize_t rst = 0;

    // ��ʹ��connect��block
    // 1.��������socket��������û�п����������£�UDPû������û�г��ַ�����Ϣ���������������ҷ���ֵ��ȷ
    // 2.��������socket�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket�������˿����������£�������û�з�����Ϣ��UDP����������Ϣ����������ʱ���ֶ��رշ����ˣ�����������
    // �����˷���Ϣ����������
    do
    {
        LOG_INFO << "TEST1 BEGIN, no connect, block";
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        LOG_INFO << "sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST1 END, no connect, block";
    } while (false);

    // UDPΪʲôҪʹ��connect��������·�ɵķ�ʱ�䣬�������Կ���
    // https://stackoverflow.com/questions/9741392/can-you-bind-and-connect-both-ends-of-a-udp-connection
    // ʹ��connect��block
    // 1.��������socket����������connect��������û�п����������£�UDPû������û�г��ַ�����Ϣ���������������ҷ���ֵ��ȷ
    // ����2�ο����ڶ����Ƿ񱨴���������û�б���
    // 2.��������socket����������connect�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket����������connect��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket����������connect�������˿����������£�������û�з�����Ϣ��UDP����������Ϣ����������ʱ���ֶ��رշ����ˣ�����������
    // �����˷���Ϣ����������
    do
    {
        LOG_INFO << "TEST2 BEGIN, connect, block";

        sockets::sz_sock_connect(csock, serverSockAddr);
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "first call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "first call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "second call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "second call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST2 END, connect, block";
    } while (false);

    // 1.���Է�����socket����������connect��������û�п����������£�����ֵ��ȷ
    // 2.��������socket����������connect�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket����������connect��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket����������connect�������˿����������£�������û�з�����Ϣ��UDP������������Ϣ
    do
    {
        LOG_INFO << "TEST3 BEGIN, connect, noblock";

        sockets::sz_sock_setnonblock(csock, true);
        sockets::sz_sock_connect(csock, serverSockAddr);
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            if (sockets::sz_wouldblock())
            {
                LOG_INFO << "async recv";
            }
            else
            {
                LOG_SYSERR << "sz_udp_recv error: " << rst;
            }
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST2 END, connect, block";
    } while (false);

    // ��������û�п����������ͣ�ֱ�ӽ��գ�����-1
    do
    {
        LOG_INFO << "TEST4 BEGIN, no connect, block";

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST4 END, no connect, block";
    } while (false);
}